

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int has_wext(int sock_fd,char *device,char *ebuf)

{
  undefined8 __s;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char local_40 [8];
  iwreq ireq;
  char *ebuf_local;
  char *device_local;
  int sock_fd_local;
  
  ireq.u._8_8_ = ebuf;
  iVar1 = is_bonding_device(sock_fd,device);
  if (iVar1 == 0) {
    strncpy(local_40,device,0x10);
    ireq.ifr_ifrn.ifrn_name[7] = '\0';
    iVar1 = ioctl(sock_fd,0x8b01,local_40);
    __s = ireq.u._8_8_;
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      pcVar3 = pcap_strerror(*piVar2);
      snprintf((char *)__s,0x100,"%s: SIOCGIWNAME: %s",device,pcVar3);
      piVar2 = __errno_location();
      if (*piVar2 == 0x13) {
        device_local._4_4_ = -5;
      }
      else {
        device_local._4_4_ = 0;
      }
    }
    else {
      device_local._4_4_ = 1;
    }
  }
  else {
    device_local._4_4_ = 0;
  }
  return device_local._4_4_;
}

Assistant:

static int
has_wext(int sock_fd, const char *device, char *ebuf)
{
	struct iwreq ireq;

	if (is_bonding_device(sock_fd, device))
		return 0;	/* bonding device, so don't even try */

	strlcpy(ireq.ifr_ifrn.ifrn_name, device,
	    sizeof ireq.ifr_ifrn.ifrn_name);
	if (ioctl(sock_fd, SIOCGIWNAME, &ireq) >= 0)
		return 1;	/* yes */
	pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
	    "%s: SIOCGIWNAME: %s", device, pcap_strerror(errno));
	if (errno == ENODEV)
		return PCAP_ERROR_NO_SUCH_DEVICE;
	return 0;
}